

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O1

Variable resolve_var(Vm *vm,char *name,size_t length)

{
  uint uVar1;
  long lVar2;
  Variable *pVVar3;
  undefined8 uStack_30;
  
  uStack_30 = 0x105bc8;
  pVVar3 = resolve_name(vm,name,length);
  if (pVVar3 != (Variable *)0x0) {
    return *pVVar3;
  }
  lVar2 = -(length + 0x31 & 0xfffffffffffffff0);
  *(undefined8 *)((long)&uStack_30 + lVar2) = 0x105c0c;
  sprintf(&stack0xffffffffffffffd8 + lVar2,"Could not find variable with name %.*s",
          length & 0xffffffff,name);
  uVar1 = (vm->compiler).scope[(ulong)((vm->compiler).previous.type != TOKEN_ERROR) * 2 + -8].cap;
  *(undefined8 *)((long)&uStack_30 + lVar2) = 0x105c33;
  printf("[Line %d] %s\n",(ulong)uVar1,&stack0xffffffffffffffd8 + lVar2);
  *(code **)((long)&uStack_30 + lVar2) = logic_and;
  longjmp((__jmp_buf_tag *)error_buf,2);
}

Assistant:

static Variable resolve_var(Vm *vm, const char *name, size_t length) {
    Variable *variable = resolve_name(vm, name, length);

    if (variable != NULL) { return *variable; }

    char message[34 + length];
    sprintf(message, "Could not find variable with name %.*s", (int) length, name);
    error(&vm->compiler, message);

    // not reachable, but clang warnings are annoying
    Variable error;
    error.index = -1;
    error.frame_offset = -1;
    return error;
}